

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qitemselectionmodel.cpp
# Opt level: O2

QItemSelection * __thiscall
QItemSelectionModel::selection(QItemSelection *__return_storage_ptr__,QItemSelectionModel *this)

{
  long lVar1;
  
  lVar1 = *(long *)(this + 8);
  (__return_storage_ptr__->super_QList<QItemSelectionRange>).d.size =
       (qsizetype)&DAT_aaaaaaaaaaaaaaaa;
  (__return_storage_ptr__->super_QList<QItemSelectionRange>).d.d = (Data *)&DAT_aaaaaaaaaaaaaaaa;
  (__return_storage_ptr__->super_QList<QItemSelectionRange>).d.ptr =
       (QItemSelectionRange *)&DAT_aaaaaaaaaaaaaaaa;
  QArrayDataPointer<QItemSelectionRange>::QArrayDataPointer
            ((QArrayDataPointer<QItemSelectionRange> *)__return_storage_ptr__,
             (QArrayDataPointer<QItemSelectionRange> *)(lVar1 + 0x80));
  QItemSelection::merge
            (__return_storage_ptr__,(QItemSelection *)(lVar1 + 0x98),
             (QFlagsStorageHelper<QItemSelectionModel::SelectionFlag,_4>)
             ((QFlagsStorageHelper<QItemSelectionModel::SelectionFlag,_4> *)(lVar1 + 0xb8))->
             super_QFlagsStorage<QItemSelectionModel::SelectionFlag>);
  QList<QItemSelectionRange>::removeIf<(anonymous_namespace)::QtFunctionObjects::IsNotValid>
            (&__return_storage_ptr__->super_QList<QItemSelectionRange>);
  return __return_storage_ptr__;
}

Assistant:

const QItemSelection QItemSelectionModel::selection() const
{
    Q_D(const QItemSelectionModel);
    QItemSelection selected = d->ranges;
    selected.merge(d->currentSelection, d->currentCommand);
    // make sure we have no invalid ranges
    // ###  should probably be handled more generic somewhere else
    selected.removeIf(QtFunctionObjects::IsNotValid());
    return selected;
}